

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::~IfcRailing(IfcRailing *this)

{
  *(undefined8 *)&this[-1].field_0x98 = 0x8733d8;
  *(undefined8 *)&this->field_0x80 = 0x8734f0;
  *(undefined8 *)&this[-1].field_0x120 = 0x873400;
  *(undefined8 *)&this[-1].field_0x130 = 0x873428;
  *(undefined8 *)&this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>.field_0x20 =
       0x873450;
  *(undefined8 *)this = 0x873478;
  *(undefined8 *)&this->field_0x38 = 0x8734a0;
  *(undefined8 *)&this->field_0x48 = 0x8734c8;
  if (*(undefined1 **)&this->field_0x58 != &this->field_0x68) {
    operator_delete(*(undefined1 **)&this->field_0x58);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x98,&PTR_construction_vtable_24__00873510);
  operator_delete(&this[-1].field_0x98);
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}